

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O0

void __thiscall
LASreadItemCompressed_POINT10_v2::~LASreadItemCompressed_POINT10_v2
          (LASreadItemCompressed_POINT10_v2 *this)

{
  IntegerCompressor *pIVar1;
  uint local_14;
  U32 i;
  LASreadItemCompressed_POINT10_v2 *this_local;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_001b00f8;
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_changed_values);
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_scan_angle_rank[0]);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_scan_angle_rank[1]);
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if (this->m_bit_byte[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,this->m_bit_byte[local_14]);
    }
    if (this->m_classification[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,this->m_classification[local_14]);
    }
    if (this->m_user_data[local_14] != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,this->m_user_data[local_14]);
    }
  }
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
    operator_delete(pIVar1);
  }
  LASreadItemCompressed::~LASreadItemCompressed(&this->super_LASreadItemCompressed);
  return;
}

Assistant:

LASreadItemCompressed_POINT10_v2::~LASreadItemCompressed_POINT10_v2()
{
  U32 i;

  dec->destroySymbolModel(m_changed_values);
  delete ic_intensity;
  dec->destroySymbolModel(m_scan_angle_rank[0]);
  dec->destroySymbolModel(m_scan_angle_rank[1]);
  delete ic_point_source_ID;
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->destroySymbolModel(m_user_data[i]);
  }
  delete ic_dx;
  delete ic_dy;
  delete ic_z;
}